

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPJacobi.cpp
# Opt level: O1

double __thiscall chrono::ChSolverPJacobi::Solve(ChSolverPJacobi *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ChConstraint *pCVar4;
  ChVariables *this_00;
  ChConstraint *pCVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  pointer ppCVar9;
  pointer ppCVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  pointer ppCVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vector<double,_std::allocator<double>_> delta_gammas;
  double old_lambda_friction [3];
  double old_lambda;
  double gi_values [3];
  undefined1 local_f8 [16];
  vector<double,_std::allocator<double>_> local_e8;
  long local_d0;
  undefined8 uStack_c8;
  double local_b8 [4];
  double local_98 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  pointer local_60;
  pointer local_58;
  ChVectorRef local_48;
  
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  this->maxviolation = 0.0;
  ppCVar10 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppCVar10) {
    uVar11 = 0;
  }
  else {
    uVar13 = 0;
    uVar14 = 1;
    do {
      (*ppCVar10[uVar13]->_vptr_ChConstraint[6])();
      ppCVar10 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10 >> 3;
      bVar6 = uVar14 < uVar11;
      uVar13 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar6);
  }
  if (uVar11 != 0) {
    iVar16 = 0;
    uVar13 = 1;
    ppCVar15 = ppCVar10;
    do {
      pCVar4 = *ppCVar15;
      iVar19 = (int)uVar13;
      if (pCVar4->mode == CONSTRAINT_FRIC) {
        local_98[iVar16] = pCVar4->g_i;
        iVar16 = iVar16 + 1;
        if (iVar16 == 3) {
          dVar30 = (local_98[0] + local_98[1] + local_98[2]) / 3.0;
          ppCVar10[iVar19 - 3]->g_i = dVar30;
          ppCVar10[iVar19 - 2]->g_i = dVar30;
          pCVar4->g_i = dVar30;
          iVar16 = 0;
        }
      }
      ppCVar15 = ppCVar15 + 1;
      bVar6 = uVar13 < uVar11;
      uVar13 = (ulong)(iVar19 + 1);
    } while (bVar6);
  }
  ppCVar9 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vvariables).
      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar9) {
    uVar17 = 1;
    uVar11 = 0;
    do {
      this_00 = ppCVar9[uVar11];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb((ChVectorRef *)&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]);
        local_d0 = 0;
        uStack_c8 = 0;
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = local_60;
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58;
        if ((long)local_58 < 0 && local_60 != (pointer)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_e8);
        if (local_d0 != 0) {
          free(*(void **)(local_d0 + -8));
        }
      }
      uVar11 = (ulong)uVar17;
      ppCVar9 = (sysd->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar17 = uVar17 + 1;
    } while (uVar11 < (ulong)((long)(sysd->vvariables).
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar9 >> 3)
            );
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    ppCVar10 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10;
    if (lVar12 != 0) {
      uVar11 = 0;
      do {
        ppCVar10[uVar11]->l_i = 0.0;
        uVar11 = uVar11 + 1;
      } while ((uVar11 & 0xffffffff) < (ulong)(lVar12 >> 3));
    }
  }
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_e8,
             (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
    iVar16 = 0;
    local_78 = 0x7fffffffffffffff;
    uStack_70 = 0x7fffffffffffffff;
    uVar17 = 0;
    do {
      this->maxviolation = 0.0;
      ppCVar10 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish == ppCVar10) {
        local_f8._0_8_ = 0.0;
      }
      else {
        auVar29 = ZEXT864(0) << 0x40;
        local_f8 = ZEXT816(0);
        uVar18 = 1;
        uVar11 = 0;
        do {
          dVar30 = auVar29._0_8_;
          if (ppCVar10[uVar11]->active == true) {
            (*ppCVar10[uVar11]->_vptr_ChConstraint[7])();
            pCVar4 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11];
            auVar23._8_8_ = 0;
            auVar23._0_8_ = pCVar4->cfm_i;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pCVar4->l_i;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = dVar30 + pCVar4->b_i;
            auVar3 = vfmadd132sd_fma(auVar23,auVar32,auVar3);
            auVar23 = auVar3;
            (*pCVar4->_vptr_ChConstraint[0xc])();
            ppCVar10 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pCVar4 = ppCVar10[uVar11];
            auVar21._8_8_ = 0x8000000000000000;
            auVar21._0_8_ = 0x8000000000000000;
            auVar21 = vxorpd_avx512vl(auVar3,auVar21);
            dVar30 = pCVar4->l_i;
            dVar31 = ((this->super_ChIterativeSolverVI).m_omega / pCVar4->g_i) * auVar21._0_8_ +
                     dVar30;
            if (pCVar4->mode == CONSTRAINT_FRIC) {
              local_b8[iVar16] = dVar30;
              pCVar4->l_i = dVar31;
              iVar19 = iVar16 + 1;
              auVar40._8_8_ = 0x7fffffffffffffff;
              auVar40._0_8_ = 0x7fffffffffffffff;
              auVar21 = vandpd_avx(auVar3,auVar40);
              uVar7 = vcmpsd_avx512f(ZEXT816(0),auVar3,1);
              auVar22._8_8_ = auVar21._8_8_;
              auVar22._0_8_ = (ulong)(iVar16 == 0) * (ulong)!(bool)((byte)uVar7 & 1) * auVar21._0_8_
              ;
              iVar16 = iVar19;
              if (iVar19 == 3) {
                uVar20 = uVar18 - 3;
                (*ppCVar10[uVar20]->_vptr_ChConstraint[0xb])();
                ppCVar10 = (sysd->vconstraints).
                           super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                dVar30 = ppCVar10[uVar20]->l_i;
                auVar24._8_8_ = 0;
                auVar24._0_8_ = dVar30;
                pCVar4 = ppCVar10[uVar18 - 2];
                dVar31 = pCVar4->l_i;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = dVar31;
                pCVar5 = ppCVar10[uVar11];
                dVar36 = pCVar5->l_i;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = dVar36;
                dVar2 = (this->super_ChIterativeSolverVI).m_shlambda;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = dVar2;
                if ((dVar2 != 1.0) || (NAN(dVar2))) {
                  dVar2 = 1.0 - dVar2;
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = dVar2 * local_b8[0];
                  auVar3 = vfmadd213sd_fma(auVar24,auVar41,auVar45);
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = dVar2 * local_b8[1];
                  auVar21 = vfmadd213sd_fma(auVar33,auVar41,auVar46);
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = dVar2 * local_b8[2];
                  auVar23 = vfmadd213sd_fma(auVar37,auVar41,auVar44);
                  dVar30 = auVar3._0_8_;
                  ppCVar10[uVar20]->l_i = dVar30;
                  dVar31 = auVar21._0_8_;
                  pCVar4->l_i = dVar31;
                  dVar36 = auVar23._0_8_;
                  pCVar5->l_i = dVar36;
                }
                local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20] = dVar30 - local_b8[0];
                local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18 - 2] = dVar31 - local_b8[1];
                local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11] = dVar36 - local_b8[2];
                iVar16 = 0;
                if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                  auVar8._8_8_ = uStack_70;
                  auVar8._0_8_ = local_78;
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = dVar30 - local_b8[0];
                  auVar3 = vandpd_avx(auVar25,auVar8);
                  auVar21 = vmaxsd_avx(local_f8,auVar3);
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = dVar31 - local_b8[1];
                  auVar3 = vandpd_avx(auVar34,auVar8);
                  auVar21 = vmaxsd_avx(auVar21,auVar3);
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = dVar36 - local_b8[2];
                  auVar3 = vandpd_avx(auVar38,auVar8);
                  local_f8 = vmaxsd_avx(auVar21,auVar3);
                }
              }
            }
            else {
              pCVar4->l_i = dVar31;
              local_b8[3] = dVar30;
              (*pCVar4->_vptr_ChConstraint[0xb])();
              pCVar4 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11];
              dVar30 = pCVar4->l_i;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = dVar30;
              dVar31 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = dVar31;
              if ((dVar31 != 1.0) || (NAN(dVar31))) {
                auVar39._8_8_ = 0;
                auVar39._0_8_ = local_b8[3] * (1.0 - dVar31);
                auVar3 = vfmadd213sd_fma(auVar26,auVar35,auVar39);
                dVar30 = auVar3._0_8_;
                pCVar4->l_i = dVar30;
              }
              auVar42._8_8_ = 0x7fffffffffffffff;
              auVar42._0_8_ = 0x7fffffffffffffff;
              auVar22 = vandpd_avx(auVar42,auVar23);
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] = dVar30 - local_b8[3];
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar27._8_8_ = 0;
                auVar27._0_8_ = dVar30 - local_b8[3];
                auVar3 = vandpd_avx(auVar27,auVar42);
                local_f8 = vmaxsd_avx(local_f8,auVar3);
              }
            }
            auVar43._8_8_ = 0x7fffffffffffffff;
            auVar43._0_8_ = 0x7fffffffffffffff;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = this->maxviolation;
            auVar3 = vandpd_avx(auVar22,auVar43);
            auVar3 = vmaxsd_avx(auVar28,auVar3);
            auVar29 = ZEXT1664(auVar3);
            this->maxviolation = auVar3._0_8_;
          }
          uVar11 = (ulong)uVar18;
          ppCVar10 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = uVar18 + 1;
        } while (uVar11 < (ulong)((long)(sysd->vconstraints).
                                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10
                                 >> 3));
      }
      ppCVar10 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppCVar10) {
        uVar11 = 0;
        uVar13 = 1;
        do {
          if (ppCVar10[uVar11]->active == true) {
            (*ppCVar10[uVar11]->_vptr_ChConstraint[8])
                      (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11]);
          }
          ppCVar10 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar6 = uVar13 < (ulong)((long)(sysd->vconstraints).
                                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10
                                  >> 3);
          uVar11 = uVar13;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (bVar6);
      }
      if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
        ChIterativeSolverVI::AtIterationEnd
                  (&this->super_ChIterativeSolverVI,this->maxviolation,(double)local_f8._0_8_,uVar17
                  );
      }
      piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
      *piVar1 = *piVar1 + 1;
    } while (((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance <=
              this->maxviolation) &&
            (uVar17 = uVar17 + 1,
            (int)uVar17 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations
            ));
  }
  dVar30 = this->maxviolation;
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar30;
}

Assistant:

double ChSolverPJacobi::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    m_iterations = 0;
    maxviolation = 0;
    double maxdeltalambda = 0;
    int i_friction_comp = 0;
    double old_lambda_friction[3];

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:

    for (unsigned int iv = 0; iv < mvariables.size(); iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    //

    std::vector<double> delta_gammas;
    delta_gammas.resize(mconstraints.size());

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // The iteration on all constraints
        //

        maxviolation = 0;
        maxdeltalambda = 0;

        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;

                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V
                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        delta_gammas[ic - 2] = new_lambda_0 - old_lambda_friction[0];
                        delta_gammas[ic - 1] = new_lambda_1 - old_lambda_friction[1];
                        delta_gammas[ic - 0] = new_lambda_2 - old_lambda_friction[2];
                        // Now do NOT update the primal variables , posticipate
                        // mconstraints[xx]->Increment_q(true_delta_xx);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 2]));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 1]));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 0]));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    // Now do NOT update the primal variables , posticipate
                    // mconstraints[ic]->Increment_q(true_delta_xx);
                    delta_gammas[ic] = new_lambda - old_lambda;

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic]));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));
            }
        }

        // Now, after all deltas are updated, sweep through all constraints and increment  q += [invM][Cq]'* delta_l
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(delta_gammas[ic]);
        }

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        m_iterations++;

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;
    }

    return maxviolation;
}